

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple16.h
# Opt level: O3

bool FastPForLib::Simple16<true>::tryme<1u,3u,4u,4u,3u,3u>(uint32_t *n,size_t len)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  if ((len != 0) && (7 < *n)) {
    return false;
  }
  bVar5 = true;
  uVar2 = (len - 1) + (ulong)(len == 0);
  uVar3 = 4;
  if (uVar2 < 4) {
    uVar3 = uVar2;
  }
  if (uVar2 != 0) {
    uVar1 = (uint)(len != 0) + (int)uVar3;
    uVar4 = (ulong)(len != 0);
    do {
      if (0xf < n[uVar4]) {
        return false;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < uVar1);
    if (4 < uVar2) {
      uVar4 = 3;
      if (uVar2 - uVar3 < 3) {
        uVar4 = uVar2 - uVar3;
      }
      uVar3 = (ulong)uVar1;
      do {
        uVar2 = uVar3 + 1;
        bVar5 = n[uVar3] < 8;
        if (!bVar5) {
          return bVar5;
        }
        uVar3 = uVar2;
      } while (uVar2 < uVar1 + (int)uVar4);
    }
  }
  return bVar5;
}

Assistant:

static bool tryme(const uint32_t *n, size_t len) {
    const uint32_t min1 = (len < num1) ? static_cast<uint32_t>(len) : num1;
    for (uint32_t i = 0; i < min1; i++) {
      if ((n[i]) >= (1U << log1))
        return false;
    }
    len -= min1;
    const uint32_t min2 = (len < num2) ? static_cast<uint32_t>(len) : num2;

    for (uint32_t i = min1; i < min1 + min2; i++) {
      if ((n[i]) >= (1U << log2))
        return false;
    }
    len -= min2;
    const uint32_t min3 = static_cast<uint32_t>((len < num3) ? len : num3);
    for (uint32_t i = min1 + min2; i < min1 + min2 + min3; i++) {
      if ((n[i]) >= (1U << log3))
        return false;
    }
    return true;
  }